

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O3

void __thiscall
TEST_MockExpectedCall_callWithBooleanParameter_Test::testBody
          (TEST_MockExpectedCall_callWithBooleanParameter_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  UtestShell *pUVar5;
  char *pcVar6;
  TestTerminator *pTVar7;
  char *pcVar8;
  SimpleString paramName;
  SimpleString local_d8;
  MockNamedValue local_c8;
  MockNamedValue local_78;
  
  SimpleString::SimpleString(&paramName,"paramName");
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[10])(pMVar1,&paramName,1);
  pUVar5 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x28])(&local_c8,pMVar1,&paramName);
  pcVar6 = SimpleString::asCharString((SimpleString *)&local_c8);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[9])
            (pUVar5,"bool",pcVar6,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0xcf,pTVar7);
  SimpleString::~SimpleString((SimpleString *)&local_c8);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x26])(&local_c8,pMVar1,&paramName);
  bVar2 = MockNamedValue::getBoolValue(&local_c8);
  MockNamedValue::~MockNamedValue(&local_c8);
  if (bVar2) {
    pUVar5 = UtestShell::getCurrent();
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
               ,0xd0,pTVar7);
  }
  else {
    pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
    (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x26])(&local_c8,pMVar1,&paramName);
    bVar2 = MockNamedValue::getBoolValue(&local_c8);
    pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
    (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x26])(&local_78,pMVar1,&paramName);
    bVar3 = MockNamedValue::getBoolValue(&local_78);
    MockNamedValue::~MockNamedValue(&local_78);
    MockNamedValue::~MockNamedValue(&local_c8);
    if (bVar2 != bVar3) {
      pUVar5 = UtestShell::getCurrent();
      (*pUVar5->_vptr_UtestShell[0x1c])
                (pUVar5,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
                 ,0xd0);
    }
    pUVar5 = UtestShell::getCurrent();
    ::StringFrom(SUB81(&local_78,0));
    pcVar6 = SimpleString::asCharString((SimpleString *)&local_78);
    pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
    (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x26])(&local_c8,pMVar1,&paramName);
    MockNamedValue::getBoolValue(&local_c8);
    ::StringFrom(SUB81(&local_d8,0));
    pcVar8 = SimpleString::asCharString(&local_d8);
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar6,pcVar8,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
               ,0xd0,pTVar7);
    SimpleString::~SimpleString(&local_d8);
    MockNamedValue::~MockNamedValue(&local_c8);
    SimpleString::~SimpleString((SimpleString *)&local_78);
  }
  pUVar5 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  uVar4 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x2a])(pMVar1,&paramName);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[8])
            (pUVar5,(ulong)(uVar4 & 0xff),"CHECK","call->hasInputParameterWithName(paramName)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0xd1,pTVar7);
  pUVar5 = UtestShell::getCurrent();
  (*(((this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call)->super_MockExpectedCall).
    _vptr_MockExpectedCall[0x3c])(&local_c8);
  pcVar6 = SimpleString::asCharString((SimpleString *)&local_c8);
  (*pUVar5->_vptr_UtestShell[0xc])
            (pUVar5,"funcName -> bool paramName: <true>",pcVar6,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0xd2);
  SimpleString::~SimpleString((SimpleString *)&local_c8);
  SimpleString::~SimpleString(&paramName);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithBooleanParameter)
{
    const SimpleString paramName = "paramName";
    bool value = true;
    call->withParameter(paramName, value);
    STRCMP_EQUAL("bool", call->getInputParameterType(paramName).asCharString());
    CHECK_EQUAL(value, call->getInputParameter(paramName).getBoolValue());
    CHECK(call->hasInputParameterWithName(paramName));
    STRCMP_CONTAINS("funcName -> bool paramName: <true>", call->callToString().asCharString());
}